

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O0

int Abc_TtSuppFindFirst(int Supp)

{
  int local_14;
  int i;
  int Supp_local;
  
  if (Supp < 1) {
    __assert_fail("Supp > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                  ,0x567,"int Abc_TtSuppFindFirst(int)");
  }
  local_14 = 0;
  while( true ) {
    if (0x1f < local_14) {
      return -1;
    }
    if ((Supp & 1 << ((byte)local_14 & 0x1f)) != 0) break;
    local_14 = local_14 + 1;
  }
  return local_14;
}

Assistant:

static inline int Abc_TtSuppFindFirst( int Supp )
{
    int i;
    assert( Supp > 0 );
    for ( i = 0; i < 32; i++ )
        if ( Supp & (1 << i) )
            return i;
    return -1;
}